

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d_dump.c
# Opt level: O2

int s98d_dump(s98context *ctx)

{
  uint uVar1;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  uint8_t *puVar8;
  int local_34;
  
  set_offset(ctx,(ulong)(ctx->header).offset_to_dump);
  puVar2 = ctx->s98_buffer;
  uVar1 = (ctx->header).offset_to_loop;
  puVar8 = puVar2 + ctx->s98_size;
  if (ctx->p < puVar2 + (ctx->header).offset_to_tag) {
    puVar8 = puVar2 + (ctx->header).offset_to_tag;
  }
  local_34 = 0;
  do {
    while( true ) {
      uVar7 = 0xffffffff;
      while( true ) {
        if (ctx->p == puVar2 + uVar1) {
          puts("\n\n[");
          uVar7 = 0xffffffff;
        }
        bVar3 = read_byte(ctx);
        if (puVar8 < ctx->p) {
          return 0;
        }
        if ((char)bVar3 < '\0') break;
        bVar4 = read_byte(ctx);
        uVar5 = read_byte(ctx);
        if (uVar7 != bVar3) {
          local_34 = printf("\n%c ",(ulong)(uint)(int)(char)(bVar3 + 0x41));
          uVar7 = (uint)bVar3;
        }
        if (0x49 < local_34) {
          local_34 = printf("\n%c ",(ulong)(uVar7 + 0x41));
        }
        iVar6 = printf("%02x:%02x ",(ulong)bVar4,uVar5);
        local_34 = local_34 + iVar6;
      }
      if (bVar3 != 0xff) break;
      printf("\n\n/");
      uVar7 = 1;
LAB_00101be2:
      step_timer(ctx,uVar7);
      print_timestamp(ctx,_stdout);
      putchar(10);
    }
    if (bVar3 == 0xfe) {
      if ((ctx->header).version == 1) {
        bVar3 = read_byte(ctx);
        uVar7 = bVar3 + 2;
      }
      else {
        uVar7 = getvv(ctx);
      }
      printf("\n\n/ %d",(ulong)uVar7);
      goto LAB_00101be2;
    }
    if (bVar3 != 0xfd) {
      return 1;
    }
    puts("\n\n]");
  } while( true );
}

Assistant:

int s98d_dump(struct s98context* ctx)
{
    int ch;
    int current_ch = -1;
    int line_chars = 0;
    struct s98header* h = &ctx->header;
    uint8_t* tag_ptr;
    uint8_t* loop_ptr;
    uint8_t* end_ptr;

    set_offset(ctx, h->offset_to_dump);
    tag_ptr = ctx->s98_buffer + h->offset_to_tag;
    loop_ptr = ctx->s98_buffer + h->offset_to_loop;
    end_ptr = ctx->s98_buffer + ctx->s98_size;
    if(ctx->p < tag_ptr)
        end_ptr = tag_ptr;

    for(;;) {
        if(ctx->p == loop_ptr) {
            printf("\n\n[\n");
            current_ch = -1;
        }
        ch = read_byte(ctx);

        if(ctx->p > end_ptr) {
            // fprintf(stderr, "end of dump reached\n");
            break;
        }

        if(ch < 0x80) {
            uint8_t addr, value;
            // register write
            addr = read_byte(ctx);
            value = read_byte(ctx);

            if(current_ch != ch) {
                char part_name = ch + 'A';
                line_chars = printf("\n%c ", part_name);
                current_ch = ch;
            }
            if(line_chars + 6 >= 80) {
                line_chars = printf("\n%c ", current_ch + 'A');
            }
            line_chars += printf("%02x:%02x ", addr, value);
            continue;
        }
        switch(ch) {
        case 0xfd:
            printf("\n\n]\n");
            current_ch = -1;
            break;
        case 0xfe:
        {
            int times = 0;
            if(h->version == 1) {
                times = read_byte(ctx) + 2;
            } else {
                times = getvv(ctx);
            }
            printf("\n\n/ %d", times);
            step_timer(ctx, times);
            print_timestamp(ctx, stdout);
            putchar('\n');
            current_ch = -1;
            break;
        }
        case 0xff:
            printf("\n\n/");
            step_timer(ctx, 1);
            print_timestamp(ctx, stdout);
            putchar('\n');
            current_ch = -1;
            break;
        default:
            // 80-fc
            return 1;
        }
    }

    return 0;
}